

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::receive(WebSocketImpl *this,size_t maxSize)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar1;
  ArrayDisposer *pAVar2;
  undefined8 start;
  bool bVar3;
  uchar *puVar4;
  size_t sVar5;
  size_t sVar6;
  uchar *puVar7;
  AsyncIoStream *pAVar8;
  uchar *puVar9;
  Array<unsigned_char> *other;
  ArrayDisposer *pAVar10;
  Exception *in_RDX;
  uint16_t code;
  unsigned_long *in_R9;
  ArrayPtr<unsigned_char> AVar11;
  StringPtr reason;
  StringPtr reason_00;
  StringPtr reason_01;
  StringPtr reason_02;
  StringPtr reason_03;
  byte local_4ba;
  undefined1 local_408 [16];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:2937:17),_unsigned_long>
  promise;
  size_t remaining;
  undefined1 local_3e0 [8];
  Type handleMessage;
  undefined1 local_378 [4];
  Mask mask;
  StringPtr local_358;
  Array<unsigned_char> local_348;
  Array<unsigned_char> *local_330;
  Array<unsigned_char> *fragment_1;
  Array<unsigned_char> *__end4_1;
  Array<unsigned_char> *__begin4_1;
  Vector<kj::Array<unsigned_char>_> *__range4_1;
  Array<unsigned_char> local_308;
  Array<unsigned_char> *local_2f0;
  Array<unsigned_char> *fragment;
  Array<unsigned_char> *__end4;
  Array<unsigned_char> *__begin4;
  Vector<kj::Array<unsigned_char>_> *__range4;
  size_t offset;
  size_t amountToAllocate;
  Maybe<unsigned_long> originalMaxSize;
  byte *payloadTarget;
  Array<unsigned_char> message;
  undefined1 auStack_288 [6];
  bool isCompressed;
  bool isFin;
  StringPtr local_278;
  byte local_262;
  byte local_261;
  undefined1 auStack_260 [6];
  bool isData;
  byte opcode;
  size_t local_258;
  undefined1 local_250 [16];
  String description;
  size_t payloadLen;
  undefined1 local_220 [32];
  Header *recvHeader;
  Exception *local_1f8;
  undefined1 local_1f0 [32];
  size_t headerSize;
  Exception local_1c0;
  undefined8 local_30;
  Exception *ex;
  Exception *_ex2692;
  size_t maxSize_local;
  WebSocketImpl *this_local;
  
  _ex2692 = in_RDX;
  maxSize_local = maxSize;
  this_local = this;
  local_30 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(maxSize + 0x178));
  ex = (Exception *)local_30;
  if ((Exception *)local_30 != (Exception *)0x0) {
    cp<kj::Exception>(&local_1c0,(Exception *)local_30);
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
              ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               this,&local_1c0);
    Exception::~Exception(&local_1c0);
    return (PromiseBase)(PromiseBase)this;
  }
  puVar4 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
  sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
  sVar5 = Header::headerSize(puVar4,sVar5);
  local_1f0._24_8_ = sVar5;
  sVar6 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
  if (sVar6 < sVar5) {
    puVar4 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    puVar7 = Array<unsigned_char>::begin((Array<unsigned_char> *)(maxSize + 0x380));
    if (puVar4 != puVar7) {
      sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
      if (sVar5 != 0) {
        puVar4 = Array<unsigned_char>::begin((Array<unsigned_char> *)(maxSize + 0x380));
        puVar7 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
        sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
        memmove(puVar4,puVar7,sVar5);
      }
      sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
      local_1f0._8_16_ =
           (undefined1  [16])
           Array<unsigned_char>::first((Array<unsigned_char> *)(maxSize + 0x380),sVar5);
      *(undefined8 *)(maxSize + 0x398) = local_1f0._8_8_;
      *(undefined8 *)(maxSize + 0x3a0) = local_1f0._16_8_;
    }
    pAVar8 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(maxSize + 0x10));
    puVar4 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    puVar7 = Array<unsigned_char>::end((Array<unsigned_char> *)(maxSize + 0x380));
    puVar9 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    (*(pAVar8->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              ((Type *)local_1f0,pAVar8,puVar4,1,(long)puVar7 - (long)puVar9);
    local_1f8 = _ex2692;
    recvHeader = (Header *)maxSize;
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_1_>
              ((Promise<unsigned_long> *)this,(Type *)local_1f0);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_1f0);
    return (PromiseBase)(PromiseBase)this;
  }
  local_220._24_8_ = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
  bVar3 = Header::hasRsv2or3((Header *)local_220._24_8_);
  start = local_1f0._24_8_;
  code = (uint16_t)maxSize;
  if (bVar3) {
    StringPtr::StringPtr((StringPtr *)(local_220 + 8),"Received frame had RSV bits 2 or 3 set");
    reason.content.size_ = local_220._8_8_;
    reason.content.ptr = (char *)0x3ea;
    sendCloseDueToError(this,code,reason);
    return (PromiseBase)(PromiseBase)this;
  }
  sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
  AVar11 = ArrayPtr<unsigned_char>::slice((ArrayPtr<unsigned_char> *)(maxSize + 0x398),start,sVar5);
  payloadLen = (size_t)AVar11.ptr;
  *(size_t *)(maxSize + 0x398) = payloadLen;
  local_220._0_8_ = AVar11.size_;
  *(undefined8 *)(maxSize + 0x3a0) = local_220._0_8_;
  description.content.disposer = (ArrayDisposer *)Header::getPayloadLen((Header *)local_220._24_8_);
  if (_ex2692 < description.content.disposer) {
    str<char_const(&)[23],unsigned_long&,char_const(&)[4],unsigned_long&>
              ((String *)(local_250 + 8),(kj *)"Message is too large: ",
               (char (*) [23])&description.content.disposer,(unsigned_long *)" > ",
               (char (*) [4])&_ex2692,in_R9);
    _auStack_260 = (ArrayPtr<const_char>)String::asPtr((String *)(local_250 + 8));
    reason_00.content.size_ = (size_t)auStack_260._0_8_;
    reason_00.content.ptr = (char *)0x3f1;
    sendCloseDueToError((WebSocketImpl *)local_250,code,reason_00);
    mv<kj::String>((String *)(local_250 + 8));
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    attach<kj::String>((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                        *)this,(String *)local_250);
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~Promise
              ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               local_250);
    String::~String((String *)(local_250 + 8));
    return (PromiseBase)(PromiseBase)this;
  }
  local_261 = Header::getOpcode((Header *)local_220._24_8_);
  local_262 = local_261 < 8;
  if (local_261 == 0) {
    bVar3 = Vector<kj::Array<unsigned_char>_>::empty
                      ((Vector<kj::Array<unsigned_char>_> *)(maxSize + 0x360));
    if (bVar3) {
      StringPtr::StringPtr(&local_278,"Unexpected continuation frame");
      reason_01.content.size_ = (size_t)local_278.content.ptr;
      reason_01.content.ptr = (char *)0x3ea;
      sendCloseDueToError(this,code,reason_01);
      return (PromiseBase)(PromiseBase)this;
    }
    local_261 = (byte)*(undefined4 *)(maxSize + 0x358);
  }
  else if (((bool)local_262) &&
          (bVar3 = Vector<kj::Array<unsigned_char>_>::empty
                             ((Vector<kj::Array<unsigned_char>_> *)(maxSize + 0x360)), !bVar3)) {
    StringPtr::StringPtr((StringPtr *)auStack_288,"Missing continuation frame");
    reason_02.content.size_ = (size_t)_auStack_288;
    reason_02.content.ptr = (char *)0x3ea;
    sendCloseDueToError(this,code,reason_02);
    return (PromiseBase)(PromiseBase)this;
  }
  message.disposer._7_1_ = Header::isFin((Header *)local_220._24_8_);
  message.disposer._6_1_ = 0;
  Array<unsigned_char>::Array((Array<unsigned_char> *)&payloadTarget);
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)&amountToAllocate);
  if ((message.disposer._7_1_ & 1) == 0) {
    if ((local_262 & 1) == 0) {
      StringPtr::StringPtr(&local_358,"Received fragmented control frame");
      reason_03.content.size_ = (size_t)local_358.content.ptr;
      reason_03.content.ptr = (char *)0x3ea;
      sendCloseDueToError(this,code,reason_03);
      goto LAB_0072de4f;
    }
    heapArray<unsigned_char>((Array<unsigned_char> *)local_378,(size_t)description.content.disposer)
    ;
    Array<unsigned_char>::operator=
              ((Array<unsigned_char> *)&payloadTarget,(Array<unsigned_char> *)local_378);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_378);
    originalMaxSize.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
         Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget);
    bVar3 = Vector<kj::Array<unsigned_char>_>::empty
                      ((Vector<kj::Array<unsigned_char>_> *)(maxSize + 0x360));
    if (bVar3) {
      *(uint *)(maxSize + 0x358) = (uint)local_261;
      bVar3 = Header::isCompressed((Header *)local_220._24_8_);
      *(bool *)(maxSize + 0x35c) = bVar3;
    }
  }
  else {
    bVar3 = Header::isCompressed((Header *)local_220._24_8_);
    if ((bVar3) || ((*(byte *)(maxSize + 0x35c) & 1) != 0)) {
      offset = (long)&(description.content.disposer)->_vptr_ArrayDisposer + 4;
      message.disposer._6_1_ = 1;
    }
    else {
      local_4ba = 0;
      if (local_261 == 1) {
        local_4ba = message.disposer._7_1_;
      }
      offset = (long)&(description.content.disposer)->_vptr_ArrayDisposer + (ulong)(local_4ba & 1);
    }
    if (((local_262 & 1) == 0) ||
       (bVar3 = Vector<kj::Array<unsigned_char>_>::empty
                          ((Vector<kj::Array<unsigned_char>_> *)(maxSize + 0x360)), bVar3)) {
      heapArray<unsigned_char>(&local_348,offset);
      Array<unsigned_char>::operator=((Array<unsigned_char> *)&payloadTarget,&local_348);
      Array<unsigned_char>::~Array(&local_348);
      Maybe<unsigned_long>::operator=
                ((Maybe<unsigned_long> *)&amountToAllocate,(unsigned_long *)&_ex2692);
      originalMaxSize.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
           Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget);
    }
    else {
      __range4 = (Vector<kj::Array<unsigned_char>_> *)0x0;
      __begin4 = (Array<unsigned_char> *)(maxSize + 0x360);
      __end4 = Vector<kj::Array<unsigned_char>_>::begin
                         ((Vector<kj::Array<unsigned_char>_> *)__begin4);
      fragment = Vector<kj::Array<unsigned_char>_>::end
                           ((Vector<kj::Array<unsigned_char>_> *)__begin4);
      for (; __end4 != fragment; __end4 = __end4 + 1) {
        local_2f0 = __end4;
        sVar5 = Array<unsigned_char>::size(__end4);
        __range4 = (Vector<kj::Array<unsigned_char>_> *)((long)&(__range4->builder).ptr + sVar5);
      }
      heapArray<unsigned_char>(&local_308,(long)&(__range4->builder).ptr + offset);
      Array<unsigned_char>::operator=((Array<unsigned_char> *)&payloadTarget,&local_308);
      Array<unsigned_char>::~Array(&local_308);
      __range4_1 = (Vector<kj::Array<unsigned_char>_> *)
                   ((long)_ex2692->trace + (long)&__range4[-4].builder.disposer);
      Maybe<unsigned_long>::operator=
                ((Maybe<unsigned_long> *)&amountToAllocate,(unsigned_long *)&__range4_1);
      __range4 = (Vector<kj::Array<unsigned_char>_> *)0x0;
      __begin4_1 = (Array<unsigned_char> *)(maxSize + 0x360);
      __end4_1 = Vector<kj::Array<unsigned_char>_>::begin
                           ((Vector<kj::Array<unsigned_char>_> *)__begin4_1);
      fragment_1 = Vector<kj::Array<unsigned_char>_>::end
                             ((Vector<kj::Array<unsigned_char>_> *)__begin4_1);
      for (; __end4_1 != fragment_1; __end4_1 = __end4_1 + 1) {
        local_330 = __end4_1;
        puVar4 = Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget);
        puVar4 = puVar4 + (long)__range4;
        puVar7 = Array<unsigned_char>::begin(local_330);
        sVar5 = Array<unsigned_char>::size(local_330);
        memcpy(puVar4,puVar7,sVar5);
        sVar5 = Array<unsigned_char>::size(local_330);
        __range4 = (Vector<kj::Array<unsigned_char>_> *)((long)&(__range4->builder).ptr + sVar5);
      }
      puVar4 = Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget);
      originalMaxSize.ptr.field_1.value = (long)puVar4 + (long)__range4;
      Vector<kj::Array<unsigned_char>_>::clear
                ((Vector<kj::Array<unsigned_char>_> *)(maxSize + 0x360));
      *(undefined4 *)(maxSize + 0x358) = 0;
      *(undefined1 *)(maxSize + 0x35c) = 0;
    }
  }
  handleMessage.payloadLen._0_4_ = Header::getMask((Header *)local_220._24_8_);
  handleMessage.this._0_1_ = local_261;
  handleMessage._8_8_ = originalMaxSize.ptr.field_1;
  handleMessage.payloadTarget = (byte *)description.content.disposer;
  handleMessage.payloadLen._4_1_ = message.disposer._7_1_ & 1;
  handleMessage._32_8_ = _ex2692;
  local_3e0 = (undefined1  [8])maxSize;
  handleMessage.message.disposer._4_4_ = handleMessage.payloadLen._0_4_;
  Maybe<unsigned_long>::Maybe
            ((Maybe<unsigned_long> *)&handleMessage.maxSize,
             (Maybe<unsigned_long> *)&amountToAllocate);
  handleMessage.originalMaxSize.ptr.field_1.value._0_1_ = message.disposer._6_1_ & 1;
  other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&payloadTarget);
  Array<unsigned_char>::Array((Array<unsigned_char> *)&handleMessage.isCompressed,other);
  pAVar2 = description.content.disposer;
  pAVar10 = (ArrayDisposer *)
            ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
  aVar1 = originalMaxSize.ptr.field_1;
  if (pAVar10 < pAVar2) {
    puVar4 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    memcpy((void *)aVar1,puVar4,sVar5);
    pAVar2 = description.content.disposer;
    sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    promise.super_PromiseBase.node.ptr = (PromiseBase)((long)pAVar2 - sVar5);
    pAVar8 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(maxSize + 0x10));
    aVar1 = originalMaxSize.ptr.field_1;
    sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    (*(pAVar8->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (local_408,pAVar8,aVar1.value + sVar5,promise.super_PromiseBase.node.ptr);
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda(unsigned_long)_2_>
              ((Promise<unsigned_long> *)(local_408 + 8),(Type *)local_408);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_408);
    ArrayPtr<unsigned_char>::operator=((ArrayPtr<unsigned_char> *)(maxSize + 0x398),(void *)0x0);
    mv<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_>
              ((Type *)local_3e0);
    Promise<void>::
    then<kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(Type *)(local_408 + 8));
    Promise<void>::~Promise((Promise<void> *)(local_408 + 8));
  }
  else {
    puVar4 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    memcpy((void *)aVar1,puVar4,(size_t)description.content.disposer);
    pAVar2 = description.content.disposer;
    sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(maxSize + 0x398));
    AVar11 = ArrayPtr<unsigned_char>::slice
                       ((ArrayPtr<unsigned_char> *)(maxSize + 0x398),(size_t)pAVar2,sVar5);
    *(ArrayPtr<unsigned_char> *)(maxSize + 0x398) = AVar11;
    NoInfer_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2811:9)>
    ::Type::operator()(this);
  }
  kj::(anonymous_namespace)::WebSocketImpl::receive(unsigned_long)::{lambda()#1}::~receive
            ((_lambda___1_ *)local_3e0);
LAB_0072de4f:
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&amountToAllocate);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&payloadTarget);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> receive(size_t maxSize) override {
    KJ_IF_SOME(ex, receiveException) {
      return kj::cp(ex);
    }

    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.first(recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this,maxSize](size_t actual) -> kj::Promise<Message> {
        receivedBytes += actual;
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.first(recvData.size() + actual);
        return receive(maxSize);
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());
    if (recvHeader.hasRsv2or3()) {
      return sendCloseDueToError(1002, "Received frame had RSV bits 2 or 3 set");
    }

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();
    if (payloadLen > maxSize) {
      auto description = kj::str("Message is too large: ", payloadLen, " > ", maxSize);
      return sendCloseDueToError(1009, description.asPtr()).attach(kj::mv(description));
    }

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      if (fragments.empty()) {
        return sendCloseDueToError(1002, "Unexpected continuation frame");
      }

      opcode = fragmentOpcode;
    } else if (isData) {
      if (!fragments.empty()) {
        return sendCloseDueToError(1002, "Missing continuation frame");
      }
    }

    bool isFin = recvHeader.isFin();
    bool isCompressed = false;

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    kj::Maybe<size_t> originalMaxSize; // maxSize from first `receive()` call
    if (isFin) {
      size_t amountToAllocate;
      if (recvHeader.isCompressed() || fragmentCompressed) {
        // Add 4 since we append 0x00 0x00 0xFF 0xFF to the tail of the payload.
        // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
        amountToAllocate = payloadLen + 4;
        isCompressed = true;
      } else {
        // Add space for NUL terminator when allocating text message.
        amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);
      }

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);
        originalMaxSize = offset + maxSize; // gives us back the original maximum message size.

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
        fragmentCompressed = false;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        originalMaxSize = maxSize; // gives us back the original maximum message size.
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      if (!isData) {
        return sendCloseDueToError(1002, "Received fragmented control frame");
      }

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
        fragmentCompressed = recvHeader.isCompressed();
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage =
        [this,opcode,payloadTarget,payloadLen,mask,isFin,maxSize,originalMaxSize,
         isCompressed,message=kj::mv(message)]() mutable
        -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        auto newMax = maxSize - message.size();
        fragments.add(kj::mv(message));
        return receive(newMax);
      }

      // Provide a reasonable error if a compressed frame is received without compression enabled.
      if (isCompressed && compressionConfig == kj::none) {
        return sendCloseDueToError(
            1002,
            "Received a WebSocket frame whose compression bit was set, but the compression "
            "extension was not negotiated for this connection.");
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            bool addNullTerminator = true;
            // We want to add the null terminator when receiving a TEXT message.
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize,
                addNullTerminator);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(kj::String(decompressed.releaseAsChars()));
              }
            }
          }
#endif // KJ_HAS_ZLIB
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
#if KJ_HAS_ZLIB
          if (isCompressed) {
            auto& config = KJ_ASSERT_NONNULL(compressionConfig);
            auto& decompressor = KJ_ASSERT_NONNULL(decompressionContext);
            KJ_ASSERT(message.size() >= 4);
            auto tail = message.slice(message.size() - 4, message.size());
            // Note that we added an additional 4 bytes to `message`s capacity to account for these
            // extra bytes. See `amountToAllocate` in the if(recvHeader.isCompressed()) block above.
            const byte tailBytes[] = {0x00, 0x00, 0xFF, 0xFF};
            memcpy(tail.begin(), tailBytes, sizeof(tailBytes));
            // We have to append 0x00 0x00 0xFF 0xFF to the message before inflating.
            // See: https://datatracker.ietf.org/doc/html/rfc7692#section-7.2.2
            if (config.inboundNoContextTakeover) {
              // We must reset context on each message.
              decompressor.reset();
            }
            
            auto decompressedOrError = decompressor.processMessage(message, originalMaxSize);
            KJ_SWITCH_ONEOF(decompressedOrError) {
              KJ_CASE_ONEOF(protocolError, ProtocolError) {
                return sendCloseDueToError(protocolError.statusCode, protocolError.description)
                    .attach(kj::mv(decompressedOrError));
              }
              KJ_CASE_ONEOF(decompressed, kj::Array<byte>) {
                return Message(decompressed.releaseAsBytes());
              }
            }
          }
#endif // KJ_HAS_ZLIB
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive(maxSize);
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive(maxSize);
        default:
          {
            auto description = kj::str("Unknown opcode ", opcode);
            return sendCloseDueToError(1002, description.asPtr()).attach(kj::mv(description));
          }
      }
    };

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([this, remaining](size_t amount) {
        receivedBytes += amount;
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }